

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbbackingstore.cpp
# Opt level: O3

bool __thiscall
QXcbBackingStoreImage::scroll(QXcbBackingStoreImage *this,QRegion *area,int dx,int dy)

{
  char cVar1;
  undefined8 uVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  QRect *src;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QPoint local_78;
  QRegion partialFlushRegion;
  QRegion destinationRegion;
  QPoint local_58;
  QRegion scrollArea;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QImage::size();
  local_48.x2.m_i = (int)uVar2 + -1;
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_48.y2.m_i = (int)((ulong)uVar2 >> 0x20) + -1;
  scrollArea.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  QRegion::operator&(&scrollArea,(QRect *)area);
  destinationRegion.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.xp.m_i = dx;
  local_58.yp.m_i = dy;
  QRegion::translated((int)&partialFlushRegion,(int)&scrollArea);
  QRegion::intersected((QRect *)&destinationRegion);
  QRegion::~QRegion(&partialFlushRegion);
  if (this->m_clientSideScroll == true) {
    cVar1 = QImage::isNull();
    if (cVar1 != '\0') {
      bVar5 = false;
      goto LAB_0013697f;
    }
    if ((this->m_shm_info).shmaddr != (uint8_t *)0x0) {
      preparePaint(this,&destinationRegion);
    }
    partialFlushRegion.d = (QRegionData *)QRegion::boundingRect();
    qt_scrollRectInImage(&this->m_qimage,(QRect *)&partialFlushRegion,&local_58);
  }
  else {
    ensureGC(this,this->m_xcb_pixmap);
    if ((this->m_shm_info).shmaddr == (uint8_t *)0x0) {
      flushPixmap(this,&scrollArea,false);
    }
    else {
      partialFlushRegion.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::intersected(&partialFlushRegion);
      local_78.xp.m_i = 0;
      local_78.yp.m_i = 0;
      shmPutImage(this,this->m_xcb_pixmap,&partialFlushRegion,&local_78);
      QRegion::operator-=(&this->m_pendingFlush,&partialFlushRegion);
      QRegion::~QRegion(&partialFlushRegion);
    }
    piVar3 = (int *)QRegion::begin();
    piVar4 = (int *)QRegion::end();
    for (; piVar3 != piVar4; piVar3 = piVar3 + 4) {
      partialFlushRegion.d = (QRegionData *)CONCAT44(piVar3[1] + dy,*piVar3 + dx);
      auVar6 = QRect::operator&((QRect *)&partialFlushRegion,&local_48);
      xcb_copy_area((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).
                    m_xcbConnection,this->m_xcb_pixmap,this->m_xcb_pixmap,this->m_gc,
                    (int)(short)*piVar3,(int)(short)piVar3[1],(int)auVar6._0_2_,(int)auVar6._4_2_,
                    (auVar6._8_4_ - auVar6._0_4_) + 1U & 0xffff,
                    (auVar6._12_4_ - auVar6._4_4_) + 1U & 0xffff);
    }
    if ((this->m_shm_info).shmaddr != (uint8_t *)0x0) {
      QRegion::operator-=(&this->m_pendingFlush,&destinationRegion);
    }
  }
  QRegion::operator|=(&this->m_scrolledRegion,&destinationRegion);
  bVar5 = true;
LAB_0013697f:
  QRegion::~QRegion(&destinationRegion);
  QRegion::~QRegion(&scrollArea);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QXcbBackingStoreImage::scroll(const QRegion &area, int dx, int dy)
{
    const QRect bounds(QPoint(), size());
    const QRegion scrollArea(area & bounds);
    const QPoint delta(dx, dy);
    const QRegion destinationRegion = scrollArea.translated(delta).intersected(bounds);

    if (m_clientSideScroll) {
        if (m_qimage.isNull())
            return false;

        if (hasShm())
            preparePaint(destinationRegion);

        const QRect rect = scrollArea.boundingRect();
        qt_scrollRectInImage(m_qimage, rect, delta);
    } else {
        ensureGC(m_xcb_pixmap);

        if (hasShm()) {
            QRegion partialFlushRegion = m_pendingFlush.intersected(scrollArea);
            shmPutImage(m_xcb_pixmap, partialFlushRegion);
            m_pendingFlush -= partialFlushRegion;
        } else {
            flushPixmap(scrollArea);
        }

        for (const QRect &src : scrollArea) {
            const QRect dst = src.translated(delta).intersected(bounds);
            xcb_copy_area(xcb_connection(),
                          m_xcb_pixmap,
                          m_xcb_pixmap,
                          m_gc,
                          src.x(), src.y(),
                          dst.x(), dst.y(),
                          dst.width(), dst.height());
        }

        if (hasShm())
            m_pendingFlush -= destinationRegion;
    }

    m_scrolledRegion |= destinationRegion;

    return true;
}